

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::GetIndexAction_Execute(EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  bool bVar1;
  BOOL BVar2;
  ScriptContext *scriptContext;
  JsRTVarsArgumentAction_InternalUse<2UL> *argAction;
  TTDVar pvVar3;
  RecyclableObject *pRVar4;
  ScriptContext *pSVar5;
  Var result;
  Var res;
  RecyclableObject *__obj_1;
  Var index;
  RecyclableObject *__obj;
  Var var;
  JsRTDoubleVarArgumentAction *action;
  ScriptContext *ctx;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext != (ScriptContext *)0x0) {
    argAction = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<2ul>,(TTD::NSLogEvents::EventKind)52>
                          (evt);
    pvVar3 = GetVarItem_0<2ul>(argAction);
    __obj = (RecyclableObject *)InflateVarInReplay(executeContext,pvVar3);
    if ((__obj != (RecyclableObject *)0x0) &&
       (BVar2 = Js::JavascriptOperators::IsObject(__obj), BVar2 != 0)) {
      pRVar4 = Js::VarTo<Js::RecyclableObject>(__obj);
      pSVar5 = Js::RecyclableObject::GetScriptContext(pRVar4);
      if (pSVar5 != scriptContext) {
        __obj = (RecyclableObject *)Js::CrossSite::MarshalVar(scriptContext,pRVar4,false);
      }
      pvVar3 = GetVarItem_1<2ul>(argAction);
      __obj_1 = (RecyclableObject *)InflateVarInReplay(executeContext,pvVar3);
      if (__obj_1 != (RecyclableObject *)0x0) {
        bVar1 = Js::VarIs<Js::RecyclableObject>(__obj_1);
        if (bVar1) {
          pRVar4 = Js::VarTo<Js::RecyclableObject>(__obj_1);
          pSVar5 = Js::RecyclableObject::GetScriptContext(pRVar4);
          if (pSVar5 != scriptContext) {
            __obj_1 = (RecyclableObject *)Js::CrossSite::MarshalVar(scriptContext,pRVar4,false);
          }
        }
        result = Js::JavascriptOperators::OP_GetElementI(__obj,__obj_1,scriptContext);
        JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<2ul>,(TTD::NSLogEvents::EventKind)52>
                  (executeContext,evt,result);
      }
    }
    return;
  }
  TTDAbort_unrecoverable_error("This should be non-null!!!");
}

Assistant:

void GetIndexAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTDoubleVarArgumentAction* action = GetInlineEventDataAs<JsRTDoubleVarArgumentAction, EventKind::GetIndexActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(var, ctx);
            Js::Var index = InflateVarInReplay(executeContext, GetVarItem_1(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(index, ctx);

            Js::Var res = Js::JavascriptOperators::OP_GetElementI(var, index, ctx);

            JsRTActionHandleResultForReplay<JsRTDoubleVarArgumentAction, EventKind::GetIndexActionTag>(executeContext, evt, res);
        }